

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O1

void __thiscall HEkkDual::majorUpdate(HEkkDual *this)

{
  int iVar1;
  HVector_ptr pHVar2;
  HEkk *this_00;
  bool bVar3;
  bool bVar4;
  long lVar5;
  HighsInt *pHVar6;
  string local_50;
  
  if (this->rebuild_reason != 0) {
    this->multi_chooseAgain = 1;
  }
  if (this->multi_chooseAgain != 0) {
    majorUpdateFtranPrepare(this);
    majorUpdateFtranParallel(this);
    majorUpdateFtranFinal(this);
    bVar3 = 0 < this->multi_nFinish;
    if (0 < this->multi_nFinish) {
      pHVar6 = &this->multi_finish[0].row_out;
      lVar5 = 0;
      do {
        pHVar2 = *(HVector_ptr *)(pHVar6 + 0x10);
        iVar1 = *pHVar6;
        this_00 = this->ekk_instance_;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"HEkkDual::majorUpdate","");
        bVar4 = HEkk::reinvertOnNumericalTrouble
                          (this_00,&local_50,&this->numericalTrouble,
                           (pHVar2->array).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[iVar1],*(double *)(pHVar6 + 4),
                           1e-07);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (bVar4) {
          this->rebuild_reason = 7;
          majorRollback(this);
          if (bVar3) {
            return;
          }
          break;
        }
        lVar5 = lVar5 + 1;
        pHVar6 = pHVar6 + 0x1e;
        bVar3 = lVar5 < this->multi_nFinish;
      } while (lVar5 < this->multi_nFinish);
    }
    majorUpdatePrimal(this);
    majorUpdateFactor(this);
    if (this->new_devex_framework == true) {
      initialiseDevexFramework(this);
    }
    iterationAnalysisMajor(this);
  }
  return;
}

Assistant:

void HEkkDual::majorUpdate() {
  /**
   * 0. See if it's ready to perform a major update
   */
  if (rebuild_reason) multi_chooseAgain = 1;
  if (!multi_chooseAgain) return;

  // Major update - FTRANs
  majorUpdateFtranPrepare();
  majorUpdateFtranParallel();
  majorUpdateFtranFinal();

  // Major update - check for roll back
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* iFinish = &multi_finish[iFn];
    HVector* iColumn = iFinish->col_aq;
    HighsInt iRow_Out = iFinish->row_out;

    // Use the two pivot values to identify numerical trouble
    if (ekk_instance_.reinvertOnNumericalTrouble(
            "HEkkDual::majorUpdate", numericalTrouble, iColumn->array[iRow_Out],
            iFinish->alpha_row, kMultiNumericalTroubleTolerance)) {
      // HighsInt startUpdate = ekk_instance_.info_.update_count -
      // multi_nFinish;
      rebuild_reason = kRebuildReasonPossiblySingularBasis;
      // if (startUpdate > 0) {
      majorRollback();
      return;
      // }
    }
  }

  // Major update - primal and factor
  majorUpdatePrimal();
  majorUpdateFactor();
  if (new_devex_framework) initialiseDevexFramework();
  iterationAnalysisMajor();
}